

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisInputNextBytes(ZydisDecoderState *state,ZydisDecodedInstruction *instruction,ZyanU8 *value,
                   ZyanU8 number_of_bytes)

{
  ZyanU8 number_of_bytes_local;
  ZyanU8 *value_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderState *state_local;
  
  if (state == (ZydisDecoderState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x154,
                  "ZyanStatus ZydisInputNextBytes(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8 *, ZyanU8)"
                 );
  }
  if (instruction != (ZydisDecodedInstruction *)0x0) {
    if (value != (ZyanU8 *)0x0) {
      if ((uint)instruction->length + (uint)number_of_bytes < 0x10) {
        if (state->buffer_len < (ulong)number_of_bytes) {
          state_local._4_4_ = 0x80200000;
        }
        else {
          instruction->length = instruction->length + number_of_bytes;
          memcpy(value,state->buffer,(ulong)number_of_bytes);
          state->buffer = state->buffer + (int)(uint)number_of_bytes;
          state->buffer_len = state->buffer_len - (ulong)number_of_bytes;
          state_local._4_4_ = 0x100000;
        }
      }
      else {
        state_local._4_4_ = 0x80200002;
      }
      return state_local._4_4_;
    }
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x156,
                  "ZyanStatus ZydisInputNextBytes(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8 *, ZyanU8)"
                 );
  }
  __assert_fail("instruction",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                ,0x155,
                "ZyanStatus ZydisInputNextBytes(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8 *, ZyanU8)"
               );
}

Assistant:

static ZyanStatus ZydisInputNextBytes(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, ZyanU8* value, ZyanU8 number_of_bytes)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(value);

    if (instruction->length + number_of_bytes > ZYDIS_MAX_INSTRUCTION_LENGTH)
    {
        return ZYDIS_STATUS_INSTRUCTION_TOO_LONG;
    }

    if (state->buffer_len >= number_of_bytes)
    {
        instruction->length += number_of_bytes;

        ZYAN_MEMCPY(value, state->buffer, number_of_bytes);
        state->buffer += number_of_bytes;
        state->buffer_len -= number_of_bytes;

        return ZYAN_STATUS_SUCCESS;
    }

    return ZYDIS_STATUS_NO_MORE_DATA;
}